

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::GridRecalculatePrimRef,_2UL>::
TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,GridRecalculatePrimRef *recalculatePrimRef)

{
  SubGridBuildData *pSVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  TemporalBinInfo *pTVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  PrimRefMB *pPVar15;
  float fVar16;
  float fVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  float fVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  ulong local_168;
  ulong local_160;
  PrimRefMB *local_158;
  size_t local_150;
  TemporalBinInfo *local_148;
  GridRecalculatePrimRef *local_140;
  BBox1f local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  anon_class_32_4_e9707c6d local_d8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_128 = time_range.upper;
  fVar30 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar26 = (set->super_PrimInfoMB).max_time_range.upper - fVar30;
  fVar17 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  local_148 = this;
  local_140 = recalculatePrimRef;
  local_138 = time_range;
  fStack_124 = local_128;
  fStack_120 = local_128;
  fStack_11c = local_128;
  fVar16 = roundf((((time_range.lower * 0.5 + local_128 * 0.5) - fVar30) / fVar26) * fVar17);
  fVar30 = (fVar16 / fVar17) * fVar26 + fVar30;
  if ((local_138.lower < fVar30) && (fVar30 < local_128)) {
    fVar16 = local_138.lower;
    local_158 = prims;
    local_150 = end;
    for (; begin < end; begin = begin + 1) {
      fVar17 = prims[begin].time_range.upper * 0.9999;
      pPVar15 = prims;
      if ((fVar16 < fVar17) && (prims[begin].time_range.lower * 1.0001 < fVar30)) {
        fVar17 = prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        pSVar1 = local_140->sgrids;
        local_d8.this =
             (GridMesh *)
             (local_140->scene->geometries).items
             [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        local_160 = (ulong)pSVar1[(uint)fVar17].sx & 0x7fff;
        local_168 = (ulong)pSVar1[(uint)fVar17].sy & 0x7fff;
        local_d8.g = (Grid *)((ulong)pSVar1[(uint)fVar17].primID *
                              *(long *)(&(local_d8.this)->field_0x60 + 8) +
                             *(long *)&((local_d8.this)->super_Geometry).field_0x58);
        local_d8.sx = &local_160;
        local_d8.sy = &local_168;
        fVar17 = ((local_d8.this)->super_Geometry).fnumTimeSegments;
        fVar26 = ((local_d8.this)->super_Geometry).time_range.lower;
        fVar21 = ((local_d8.this)->super_Geometry).time_range.upper - fVar26;
        fVar27 = (fVar16 - fVar26) / fVar21;
        fVar21 = (fVar30 - fVar26) / fVar21;
        fVar32 = fVar17 * fVar21;
        fVar16 = floorf(fVar17 * fVar27);
        fVar26 = ceilf(fVar32);
        iVar13 = (int)fVar16;
        if (fVar16 <= 0.0) {
          fVar16 = 0.0;
        }
        fVar22 = fVar26;
        if (fVar17 <= fVar26) {
          fVar22 = fVar17;
        }
        iVar12 = -1;
        if (-1 < iVar13) {
          iVar12 = iVar13;
        }
        iVar10 = (int)fVar17 + 1;
        if ((int)fVar26 < (int)fVar17 + 1) {
          iVar10 = (int)fVar26;
        }
        GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                  (&blower0,&local_d8,(long)(int)fVar16);
        GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                  (&bupper1,&local_d8,(long)(int)fVar22);
        fVar26 = fVar17 * fVar27 - fVar16;
        if (iVar10 - iVar12 == 1) {
          if (fVar26 <= 0.0) {
            fVar26 = 0.0;
          }
          fVar16 = 1.0 - fVar26;
          fVar38 = fVar16 * blower0.lower.field_0.m128[0] + fVar26 * bupper1.lower.field_0.m128[0];
          fVar39 = fVar16 * blower0.lower.field_0.m128[1] + fVar26 * bupper1.lower.field_0.m128[1];
          fVar40 = fVar16 * blower0.lower.field_0.m128[2] + fVar26 * bupper1.lower.field_0.m128[2];
          fVar41 = fVar16 * blower0.lower.field_0.m128[3] + fVar26 * bupper1.lower.field_0.m128[3];
          fVar35 = fVar16 * blower0.upper.field_0.m128[0] + fVar26 * bupper1.upper.field_0.m128[0];
          fVar36 = fVar16 * blower0.upper.field_0.m128[1] + fVar26 * bupper1.upper.field_0.m128[1];
          fVar37 = fVar16 * blower0.upper.field_0.m128[2] + fVar26 * bupper1.upper.field_0.m128[2];
          fVar26 = fVar16 * blower0.upper.field_0.m128[3] + fVar26 * bupper1.upper.field_0.m128[3];
          fVar22 = fVar22 - fVar32;
          if (fVar22 <= 0.0) {
            fVar22 = 0.0;
          }
          fVar16 = 1.0 - fVar22;
          fVar42 = bupper1.lower.field_0.m128[0] * fVar16 + blower0.lower.field_0.m128[0] * fVar22;
          fVar43 = bupper1.lower.field_0.m128[1] * fVar16 + blower0.lower.field_0.m128[1] * fVar22;
          fVar44 = bupper1.lower.field_0.m128[2] * fVar16 + blower0.lower.field_0.m128[2] * fVar22;
          fVar45 = bupper1.lower.field_0.m128[3] * fVar16 + blower0.lower.field_0.m128[3] * fVar22;
          fVar32 = fVar16 * bupper1.upper.field_0.m128[0] + fVar22 * blower0.upper.field_0.m128[0];
          fVar33 = fVar16 * bupper1.upper.field_0.m128[1] + fVar22 * blower0.upper.field_0.m128[1];
          fVar34 = fVar16 * bupper1.upper.field_0.m128[2] + fVar22 * blower0.upper.field_0.m128[2];
          fVar16 = fVar16 * bupper1.upper.field_0.m128[3] + fVar22 * blower0.upper.field_0.m128[3];
        }
        else {
          GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                    (&blower1,&local_d8,(long)((int)fVar16 + 1));
          GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                    (&bupper0,&local_d8,(long)((int)fVar22 + -1));
          if (fVar26 <= 0.0) {
            fVar26 = 0.0;
          }
          fVar16 = 1.0 - fVar26;
          fVar38 = blower0.lower.field_0.m128[0] * fVar16 + blower1.lower.field_0.m128[0] * fVar26;
          fVar39 = blower0.lower.field_0.m128[1] * fVar16 + blower1.lower.field_0.m128[1] * fVar26;
          fVar40 = blower0.lower.field_0.m128[2] * fVar16 + blower1.lower.field_0.m128[2] * fVar26;
          fVar41 = blower0.lower.field_0.m128[3] * fVar16 + blower1.lower.field_0.m128[3] * fVar26;
          fVar35 = fVar16 * blower0.upper.field_0.m128[0] + fVar26 * blower1.upper.field_0.m128[0];
          fVar36 = fVar16 * blower0.upper.field_0.m128[1] + fVar26 * blower1.upper.field_0.m128[1];
          fVar37 = fVar16 * blower0.upper.field_0.m128[2] + fVar26 * blower1.upper.field_0.m128[2];
          fVar26 = fVar16 * blower0.upper.field_0.m128[3] + fVar26 * blower1.upper.field_0.m128[3];
          fVar16 = fVar22 - fVar32;
          if (fVar22 - fVar32 <= 0.0) {
            fVar16 = 0.0;
          }
          fVar22 = 1.0 - fVar16;
          fVar42 = bupper1.lower.field_0.m128[0] * fVar22 + bupper0.lower.field_0.m128[0] * fVar16;
          fVar43 = bupper1.lower.field_0.m128[1] * fVar22 + bupper0.lower.field_0.m128[1] * fVar16;
          fVar44 = bupper1.lower.field_0.m128[2] * fVar22 + bupper0.lower.field_0.m128[2] * fVar16;
          fVar45 = bupper1.lower.field_0.m128[3] * fVar22 + bupper0.lower.field_0.m128[3] * fVar16;
          fVar32 = fVar22 * bupper1.upper.field_0.m128[0] + fVar16 * bupper0.upper.field_0.m128[0];
          fVar33 = fVar22 * bupper1.upper.field_0.m128[1] + fVar16 * bupper0.upper.field_0.m128[1];
          fVar34 = fVar22 * bupper1.upper.field_0.m128[2] + fVar16 * bupper0.upper.field_0.m128[2];
          fVar16 = fVar22 * bupper1.upper.field_0.m128[3] + fVar16 * bupper0.upper.field_0.m128[3];
          if (iVar13 < 0) {
            iVar13 = -1;
          }
          sVar14 = (size_t)iVar13;
          while (sVar14 = sVar14 + 1, (long)sVar14 < (long)iVar10) {
            fVar22 = ((float)(int)sVar14 / fVar17 - fVar27) / (fVar21 - fVar27);
            fVar28 = 1.0 - fVar22;
            local_a8 = fVar38 * fVar28 + fVar42 * fVar22;
            fStack_a4 = fVar39 * fVar28 + fVar43 * fVar22;
            fStack_a0 = fVar40 * fVar28 + fVar44 * fVar22;
            fStack_9c = fVar41 * fVar28 + fVar45 * fVar22;
            local_b8 = fVar28 * fVar35 + fVar22 * fVar32;
            fStack_b4 = fVar28 * fVar36 + fVar22 * fVar33;
            fStack_b0 = fVar28 * fVar37 + fVar22 * fVar34;
            fStack_ac = fVar28 * fVar26 + fVar22 * fVar16;
            GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()(&bi,&local_d8,sVar14);
            auVar20._0_4_ = bi.lower.field_0.m128[0] - local_a8;
            auVar20._4_4_ = bi.lower.field_0.m128[1] - fStack_a4;
            auVar20._8_4_ = bi.lower.field_0.m128[2] - fStack_a0;
            auVar20._12_4_ = bi.lower.field_0.m128[3] - fStack_9c;
            auVar25._0_4_ = bi.upper.field_0.m128[0] - local_b8;
            auVar25._4_4_ = bi.upper.field_0.m128[1] - fStack_b4;
            auVar25._8_4_ = bi.upper.field_0.m128[2] - fStack_b0;
            auVar25._12_4_ = bi.upper.field_0.m128[3] - fStack_ac;
            auVar20 = minps(auVar20,ZEXT816(0));
            auVar25 = maxps(auVar25,ZEXT816(0));
            fVar38 = fVar38 + auVar20._0_4_;
            fVar39 = fVar39 + auVar20._4_4_;
            fVar40 = fVar40 + auVar20._8_4_;
            fVar41 = fVar41 + auVar20._12_4_;
            fVar42 = fVar42 + auVar20._0_4_;
            fVar43 = fVar43 + auVar20._4_4_;
            fVar44 = fVar44 + auVar20._8_4_;
            fVar45 = fVar45 + auVar20._12_4_;
            fVar35 = fVar35 + auVar25._0_4_;
            fVar36 = fVar36 + auVar25._4_4_;
            fVar37 = fVar37 + auVar25._8_4_;
            fVar26 = fVar26 + auVar25._12_4_;
            fVar32 = fVar32 + auVar25._0_4_;
            fVar33 = fVar33 + auVar25._4_4_;
            fVar34 = fVar34 + auVar25._8_4_;
            fVar16 = fVar16 + auVar25._12_4_;
          }
        }
        pTVar11 = local_148;
        auVar6._4_4_ = fVar39;
        auVar6._0_4_ = fVar38;
        auVar6._8_4_ = fVar40;
        auVar6._12_4_ = fVar41;
        aVar18.m128 = (__m128)minps(local_148->bounds0[0].bounds0.lower.field_0,auVar6);
        auVar4._4_4_ = fVar36;
        auVar4._0_4_ = fVar35;
        auVar4._8_4_ = fVar37;
        auVar4._12_4_ = fVar26;
        aVar23.m128 = (__m128)maxps(local_148->bounds0[0].bounds0.upper.field_0,auVar4);
        auVar8._4_4_ = fVar43;
        auVar8._0_4_ = fVar42;
        auVar8._8_4_ = fVar44;
        auVar8._12_4_ = fVar45;
        aVar29.m128 = (__m128)minps(local_148->bounds0[0].bounds1.lower.field_0,auVar8);
        auVar2._4_4_ = fVar33;
        auVar2._0_4_ = fVar32;
        auVar2._8_4_ = fVar34;
        auVar2._12_4_ = fVar16;
        aVar31.m128 = (__m128)maxps(local_148->bounds0[0].bounds1.upper.field_0,auVar2);
        local_148->bounds0[0].bounds0.lower.field_0 = aVar18;
        local_148->bounds0[0].bounds0.upper.field_0 = aVar23;
        local_148->bounds0[0].bounds1.lower.field_0 = aVar29;
        local_148->bounds0[0].bounds1.upper.field_0 = aVar31;
        fVar27 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar26 = prims[begin].time_range.lower;
        fVar21 = prims[begin].time_range.upper - fVar26;
        fVar17 = floorf(((local_138.lower - fVar26) / fVar21) * 1.0000002 * fVar27);
        fVar16 = 0.0;
        if (0.0 <= fVar17) {
          fVar16 = fVar17;
        }
        fVar17 = ceilf(((fVar30 - fVar26) / fVar21) * 0.99999976 * fVar27);
        if (fVar27 <= fVar17) {
          fVar17 = fVar27;
        }
        pTVar11->count0[0] = pTVar11->count0[0] + (long)((int)fVar17 - (int)fVar16);
        fVar17 = prims[begin].time_range.upper * 0.9999;
        end = local_150;
        pPVar15 = local_158;
        fVar16 = local_138.lower;
      }
      if ((fVar30 < fVar17) && (prims[begin].time_range.lower * 1.0001 < local_128)) {
        fVar16 = prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        pSVar1 = local_140->sgrids;
        local_d8.this =
             (GridMesh *)
             (local_140->scene->geometries).items
             [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        local_160 = (ulong)pSVar1[(uint)fVar16].sx & 0x7fff;
        local_168 = (ulong)pSVar1[(uint)fVar16].sy & 0x7fff;
        local_d8.g = (Grid *)((ulong)pSVar1[(uint)fVar16].primID *
                              *(long *)(&(local_d8.this)->field_0x60 + 8) +
                             *(long *)&((local_d8.this)->super_Geometry).field_0x58);
        local_d8.sx = &local_160;
        local_d8.sy = &local_168;
        fVar16 = ((local_d8.this)->super_Geometry).fnumTimeSegments;
        fVar17 = ((local_d8.this)->super_Geometry).time_range.lower;
        fVar21 = ((local_d8.this)->super_Geometry).time_range.upper - fVar17;
        fVar27 = (fVar30 - fVar17) / fVar21;
        fVar21 = (local_128 - fVar17) / fVar21;
        fVar32 = fVar16 * fVar21;
        fVar17 = floorf(fVar16 * fVar27);
        fVar26 = ceilf(fVar32);
        iVar13 = (int)fVar17;
        if (fVar17 <= 0.0) {
          fVar17 = 0.0;
        }
        fVar22 = fVar26;
        if (fVar16 <= fVar26) {
          fVar22 = fVar16;
        }
        iVar12 = -1;
        if (-1 < iVar13) {
          iVar12 = iVar13;
        }
        iVar10 = (int)fVar16 + 1;
        if ((int)fVar26 < (int)fVar16 + 1) {
          iVar10 = (int)fVar26;
        }
        GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                  (&blower0,&local_d8,(long)(int)fVar17);
        GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                  (&bupper1,&local_d8,(long)(int)fVar22);
        fVar26 = fVar16 * fVar27 - fVar17;
        if (iVar10 - iVar12 == 1) {
          if (fVar26 <= 0.0) {
            fVar26 = 0.0;
          }
          fVar16 = 1.0 - fVar26;
          fVar38 = fVar16 * blower0.lower.field_0.m128[0] + fVar26 * bupper1.lower.field_0.m128[0];
          fVar39 = fVar16 * blower0.lower.field_0.m128[1] + fVar26 * bupper1.lower.field_0.m128[1];
          fVar40 = fVar16 * blower0.lower.field_0.m128[2] + fVar26 * bupper1.lower.field_0.m128[2];
          fVar41 = fVar16 * blower0.lower.field_0.m128[3] + fVar26 * bupper1.lower.field_0.m128[3];
          fVar35 = fVar16 * blower0.upper.field_0.m128[0] + fVar26 * bupper1.upper.field_0.m128[0];
          fVar36 = fVar16 * blower0.upper.field_0.m128[1] + fVar26 * bupper1.upper.field_0.m128[1];
          fVar37 = fVar16 * blower0.upper.field_0.m128[2] + fVar26 * bupper1.upper.field_0.m128[2];
          fVar26 = fVar16 * blower0.upper.field_0.m128[3] + fVar26 * bupper1.upper.field_0.m128[3];
          fVar22 = fVar22 - fVar32;
          if (fVar22 <= 0.0) {
            fVar22 = 0.0;
          }
          fVar16 = 1.0 - fVar22;
          fVar42 = bupper1.lower.field_0.m128[0] * fVar16 + blower0.lower.field_0.m128[0] * fVar22;
          fVar43 = bupper1.lower.field_0.m128[1] * fVar16 + blower0.lower.field_0.m128[1] * fVar22;
          fVar44 = bupper1.lower.field_0.m128[2] * fVar16 + blower0.lower.field_0.m128[2] * fVar22;
          fVar45 = bupper1.lower.field_0.m128[3] * fVar16 + blower0.lower.field_0.m128[3] * fVar22;
          fVar32 = fVar16 * bupper1.upper.field_0.m128[0] + fVar22 * blower0.upper.field_0.m128[0];
          fVar33 = fVar16 * bupper1.upper.field_0.m128[1] + fVar22 * blower0.upper.field_0.m128[1];
          fVar34 = fVar16 * bupper1.upper.field_0.m128[2] + fVar22 * blower0.upper.field_0.m128[2];
          fVar17 = fVar16 * bupper1.upper.field_0.m128[3] + fVar22 * blower0.upper.field_0.m128[3];
        }
        else {
          GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                    (&blower1,&local_d8,(long)((int)fVar17 + 1));
          GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                    (&bupper0,&local_d8,(long)((int)fVar22 + -1));
          if (fVar26 <= 0.0) {
            fVar26 = 0.0;
          }
          fVar17 = 1.0 - fVar26;
          fVar38 = blower0.lower.field_0.m128[0] * fVar17 + blower1.lower.field_0.m128[0] * fVar26;
          fVar39 = blower0.lower.field_0.m128[1] * fVar17 + blower1.lower.field_0.m128[1] * fVar26;
          fVar40 = blower0.lower.field_0.m128[2] * fVar17 + blower1.lower.field_0.m128[2] * fVar26;
          fVar41 = blower0.lower.field_0.m128[3] * fVar17 + blower1.lower.field_0.m128[3] * fVar26;
          fVar35 = fVar17 * blower0.upper.field_0.m128[0] + fVar26 * blower1.upper.field_0.m128[0];
          fVar36 = fVar17 * blower0.upper.field_0.m128[1] + fVar26 * blower1.upper.field_0.m128[1];
          fVar37 = fVar17 * blower0.upper.field_0.m128[2] + fVar26 * blower1.upper.field_0.m128[2];
          fVar26 = fVar17 * blower0.upper.field_0.m128[3] + fVar26 * blower1.upper.field_0.m128[3];
          fVar17 = fVar22 - fVar32;
          if (fVar22 - fVar32 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar22 = 1.0 - fVar17;
          fVar42 = bupper1.lower.field_0.m128[0] * fVar22 + bupper0.lower.field_0.m128[0] * fVar17;
          fVar43 = bupper1.lower.field_0.m128[1] * fVar22 + bupper0.lower.field_0.m128[1] * fVar17;
          fVar44 = bupper1.lower.field_0.m128[2] * fVar22 + bupper0.lower.field_0.m128[2] * fVar17;
          fVar45 = bupper1.lower.field_0.m128[3] * fVar22 + bupper0.lower.field_0.m128[3] * fVar17;
          fVar32 = fVar22 * bupper1.upper.field_0.m128[0] + fVar17 * bupper0.upper.field_0.m128[0];
          fVar33 = fVar22 * bupper1.upper.field_0.m128[1] + fVar17 * bupper0.upper.field_0.m128[1];
          fVar34 = fVar22 * bupper1.upper.field_0.m128[2] + fVar17 * bupper0.upper.field_0.m128[2];
          fVar17 = fVar22 * bupper1.upper.field_0.m128[3] + fVar17 * bupper0.upper.field_0.m128[3];
          if (iVar13 < 0) {
            iVar13 = -1;
          }
          sVar14 = (size_t)iVar13;
          while (sVar14 = sVar14 + 1, (long)sVar14 < (long)iVar10) {
            fVar22 = ((float)(int)sVar14 / fVar16 - fVar27) / (fVar21 - fVar27);
            fVar28 = 1.0 - fVar22;
            local_a8 = fVar38 * fVar28 + fVar42 * fVar22;
            fStack_a4 = fVar39 * fVar28 + fVar43 * fVar22;
            fStack_a0 = fVar40 * fVar28 + fVar44 * fVar22;
            fStack_9c = fVar41 * fVar28 + fVar45 * fVar22;
            local_b8 = fVar28 * fVar35 + fVar22 * fVar32;
            fStack_b4 = fVar28 * fVar36 + fVar22 * fVar33;
            fStack_b0 = fVar28 * fVar37 + fVar22 * fVar34;
            fStack_ac = fVar28 * fVar26 + fVar22 * fVar17;
            GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()(&bi,&local_d8,sVar14);
            auVar19._0_4_ = bi.lower.field_0.m128[0] - local_a8;
            auVar19._4_4_ = bi.lower.field_0.m128[1] - fStack_a4;
            auVar19._8_4_ = bi.lower.field_0.m128[2] - fStack_a0;
            auVar19._12_4_ = bi.lower.field_0.m128[3] - fStack_9c;
            auVar24._0_4_ = bi.upper.field_0.m128[0] - local_b8;
            auVar24._4_4_ = bi.upper.field_0.m128[1] - fStack_b4;
            auVar24._8_4_ = bi.upper.field_0.m128[2] - fStack_b0;
            auVar24._12_4_ = bi.upper.field_0.m128[3] - fStack_ac;
            auVar20 = minps(auVar19,ZEXT816(0));
            auVar25 = maxps(auVar24,ZEXT816(0));
            fVar38 = fVar38 + auVar20._0_4_;
            fVar39 = fVar39 + auVar20._4_4_;
            fVar40 = fVar40 + auVar20._8_4_;
            fVar41 = fVar41 + auVar20._12_4_;
            fVar42 = fVar42 + auVar20._0_4_;
            fVar43 = fVar43 + auVar20._4_4_;
            fVar44 = fVar44 + auVar20._8_4_;
            fVar45 = fVar45 + auVar20._12_4_;
            fVar35 = fVar35 + auVar25._0_4_;
            fVar36 = fVar36 + auVar25._4_4_;
            fVar37 = fVar37 + auVar25._8_4_;
            fVar26 = fVar26 + auVar25._12_4_;
            fVar32 = fVar32 + auVar25._0_4_;
            fVar33 = fVar33 + auVar25._4_4_;
            fVar34 = fVar34 + auVar25._8_4_;
            fVar17 = fVar17 + auVar25._12_4_;
          }
        }
        pTVar11 = local_148;
        auVar7._4_4_ = fVar39;
        auVar7._0_4_ = fVar38;
        auVar7._8_4_ = fVar40;
        auVar7._12_4_ = fVar41;
        aVar18.m128 = (__m128)minps(local_148->bounds1[0].bounds0.lower.field_0,auVar7);
        auVar5._4_4_ = fVar36;
        auVar5._0_4_ = fVar35;
        auVar5._8_4_ = fVar37;
        auVar5._12_4_ = fVar26;
        aVar23.m128 = (__m128)maxps(local_148->bounds1[0].bounds0.upper.field_0,auVar5);
        auVar9._4_4_ = fVar43;
        auVar9._0_4_ = fVar42;
        auVar9._8_4_ = fVar44;
        auVar9._12_4_ = fVar45;
        aVar29.m128 = (__m128)minps(local_148->bounds1[0].bounds1.lower.field_0,auVar9);
        auVar3._4_4_ = fVar33;
        auVar3._0_4_ = fVar32;
        auVar3._8_4_ = fVar34;
        auVar3._12_4_ = fVar17;
        aVar31.m128 = (__m128)maxps(local_148->bounds1[0].bounds1.upper.field_0,auVar3);
        local_148->bounds1[0].bounds0.lower.field_0 = aVar18;
        local_148->bounds1[0].bounds0.upper.field_0 = aVar23;
        local_148->bounds1[0].bounds1.lower.field_0 = aVar29;
        local_148->bounds1[0].bounds1.upper.field_0 = aVar31;
        fVar27 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar16 = prims[begin].time_range.lower;
        fVar26 = prims[begin].time_range.upper - fVar16;
        fVar21 = local_128 - fVar16;
        fVar17 = floorf(((fVar30 - fVar16) / fVar26) * 1.0000002 * fVar27);
        fVar16 = 0.0;
        if (0.0 <= fVar17) {
          fVar16 = fVar17;
        }
        fVar17 = ceilf((fVar21 / fVar26) * 0.99999976 * fVar27);
        if (fVar27 <= fVar17) {
          fVar17 = fVar27;
        }
        pTVar11->count1[0] = pTVar11->count1[0] + (long)((int)fVar17 - (int)fVar16);
        end = local_150;
        pPVar15 = local_158;
        fVar16 = local_138.lower;
      }
      prims = pPVar15;
    }
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }